

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2_enc.c
# Opt level: O0

void * sm2_dupctx(void *vpsm2ctx)

{
  int iVar1;
  void *in_RDI;
  PROV_SM2_CTX *dstctx;
  PROV_SM2_CTX *srcctx;
  PROV_DIGEST *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  void *local_8;
  
  local_8 = CRYPTO_zalloc((size_t)in_RDI,(char *)in_RDI,
                          (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (local_8 == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    memcpy(local_8,in_RDI,0x28);
    if ((*(long *)((long)local_8 + 8) == 0) ||
       (iVar1 = EC_KEY_up_ref(*(EC_KEY **)((long)local_8 + 8)), iVar1 != 0)) {
      iVar1 = ossl_prov_digest_copy(in_stack_ffffffffffffffd8,(PROV_DIGEST *)0x2eaa9f);
      if (iVar1 == 0) {
        sm2_freectx(local_8);
        local_8 = (void *)0x0;
      }
    }
    else {
      CRYPTO_free(local_8);
      local_8 = (void *)0x0;
    }
  }
  return local_8;
}

Assistant:

static void *sm2_dupctx(void *vpsm2ctx)
{
    PROV_SM2_CTX *srcctx = (PROV_SM2_CTX *)vpsm2ctx;
    PROV_SM2_CTX *dstctx;

    dstctx = OPENSSL_zalloc(sizeof(*srcctx));
    if (dstctx == NULL)
        return NULL;

    *dstctx = *srcctx;
    if (dstctx->key != NULL && !EC_KEY_up_ref(dstctx->key)) {
        OPENSSL_free(dstctx);
        return NULL;
    }

    if (!ossl_prov_digest_copy(&dstctx->md, &srcctx->md)) {
        sm2_freectx(dstctx);
        return NULL;
    }

    return dstctx;
}